

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::RowSingletonPS::execute
          (RowSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  SVectorBase<double> *this_00;
  int iVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double dVar11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double dVar12;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar1];
    rStatus->data[iVar2] = rStatus->data[iVar1];
  }
  this_00 = &(this->m_col).super_SVectorBase<double>;
  dVar10 = SVectorBase<double>::operator[](this_00,iVar1);
  lVar6 = (long)this->m_j;
  pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->m_i;
  lVar5 = (long)iVar1;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar5] = pdVar3[lVar6] * dVar10;
  dVar16 = this->m_obj;
  lVar8 = (long)(this->m_col).super_SVectorBase<double>.memused;
  if (0 < lVar8) {
    pNVar4 = this_00->m_elem;
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)&pNVar4->idx + lVar9);
      if (iVar2 != iVar1) {
        dVar16 = dVar16 - *(double *)((long)&pNVar4->val + lVar9) *
                          (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2];
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar8 * 0x10 != lVar9);
  }
  switch(cStatus->data[lVar6]) {
  case ON_UPPER:
    dVar12 = this->m_oldUp;
    goto LAB_001f7e07;
  case ON_LOWER:
    dVar12 = this->m_oldLo;
LAB_001f7e07:
    dVar11 = pdVar3[lVar6];
    (*(this->super_PostStep)._vptr_PostStep[6])(this,0);
    dVar13 = ABS(dVar11);
    dVar17 = ABS(dVar12);
    if (ABS(dVar12) <= dVar13) {
      dVar17 = dVar13;
    }
    if (dVar17 <= 1.0) {
      dVar17 = 1.0;
    }
    if (ABS((dVar12 - dVar11) / dVar17) <= extraout_XMM0_Qa_03) {
      iVar1 = this->m_i;
      rStatus->data[iVar1] = BASIC;
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = this->m_row_obj;
      lVar6 = (long)this->m_j;
      y = r;
    }
    else {
      iVar1 = this->m_j;
      cStatus->data[iVar1] = BASIC;
      dVar17 = this->m_lhs / dVar10;
      dVar12 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar11 = ABS(dVar17);
      dVar13 = ABS(dVar12);
      if (dVar11 <= dVar13) {
        dVar11 = dVar13;
      }
      if (dVar11 <= 1.0) {
        dVar11 = 1.0;
      }
      iVar1 = this->m_i;
      rStatus->data[iVar1] = (uint)(ABS((dVar17 - dVar12) / dVar11) <= extraout_XMM0_Qa_04);
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = dVar16 / dVar10;
      lVar6 = (long)this->m_j;
LAB_001f7f04:
      dVar16 = 0.0;
      y = r;
    }
    break;
  case FIXED:
    auVar21._0_8_ = this->m_lhs;
    auVar21._8_8_ = this->m_rhs;
    uVar7 = (uint)(0.0 < dVar10);
    auVar20._0_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
    auVar20._4_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
    auVar20._8_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
    auVar20._12_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
    auVar14._8_4_ = (int)auVar21._0_8_;
    auVar14._0_8_ = auVar21._8_8_;
    auVar14._12_4_ = (int)((ulong)auVar21._0_8_ >> 0x20);
    auVar15._8_8_ = dVar10;
    auVar15._0_8_ = dVar10;
    auVar21 = divpd(~auVar20 & auVar14 | auVar21 & auVar20,auVar15);
    dVar12 = auVar21._0_8_;
    dVar11 = auVar21._8_8_;
    if ((dVar12 <= this->m_oldLo) && (this->m_oldUp <= dVar11)) {
LAB_001f81f9:
      rStatus->data[lVar5] = BASIC;
      dVar16 = this->m_row_obj;
      lVar6 = lVar5;
      break;
    }
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar19 = SUB168(auVar21 & _DAT_00601100,8);
    dVar13 = SUB168(auVar21 & _DAT_00601100,0);
    dVar17 = dVar13;
    if (dVar13 <= dVar19) {
      dVar17 = dVar19;
    }
    if (dVar17 <= 1.0) {
      dVar17 = 1.0;
    }
    if ((double)((ulong)((dVar12 - dVar11) / dVar17) & (ulong)DAT_00601100) <= extraout_XMM0_Qa) {
      dVar12 = this->m_oldLo;
      dVar11 = this->m_oldUp;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar17 = ABS(dVar12);
      dVar13 = ABS(dVar11);
      if (dVar17 <= dVar13) {
        dVar17 = dVar13;
      }
      if (dVar17 <= 1.0) {
        dVar17 = 1.0;
      }
      if (ABS((dVar12 - dVar11) / dVar17) <= extraout_XMM0_Qa_05) {
LAB_001f81f5:
        lVar5 = (long)this->m_i;
        goto LAB_001f81f9;
      }
      dVar12 = this->m_oldLo;
      dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[this->m_j];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar17 = ABS(dVar12);
      dVar13 = ABS(dVar11);
      if (dVar17 <= dVar13) {
        dVar17 = dVar13;
      }
      if (dVar17 <= 1.0) {
        dVar17 = 1.0;
      }
      if ((extraout_XMM0_Qa_06 < ABS((dVar12 - dVar11) / dVar17)) ||
         (dVar12 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j],
         (*(this->super_PostStep)._vptr_PostStep[6])(this), -extraout_XMM0_Qa_07 < dVar12)) {
        dVar12 = this->m_oldUp;
        dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        dVar17 = ABS(dVar12);
        dVar13 = ABS(dVar11);
        if (dVar17 <= dVar13) {
          dVar17 = dVar13;
        }
        if (dVar17 <= 1.0) {
          dVar17 = 1.0;
        }
        if ((extraout_XMM0_Qa_08 < ABS((dVar12 - dVar11) / dVar17)) ||
           (dVar12 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_j],
           (*(this->super_PostStep)._vptr_PostStep[6])(this), dVar12 < extraout_XMM0_Qa_09)) {
          dVar12 = this->m_oldLo;
          dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j];
          (*(this->super_PostStep)._vptr_PostStep[6])(this);
          dVar17 = ABS(dVar12);
          dVar13 = ABS(dVar11);
          if (dVar17 <= dVar13) {
            dVar17 = dVar13;
          }
          if (dVar17 <= 1.0) {
            dVar17 = 1.0;
          }
          if (extraout_XMM0_Qa_10 < ABS((dVar12 - dVar11) / dVar17)) {
            dVar12 = this->m_oldUp;
            dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_j];
            (*(this->super_PostStep)._vptr_PostStep[6])(this);
            dVar17 = ABS(dVar12);
            dVar13 = ABS(dVar11);
            if (dVar17 <= dVar13) {
              dVar17 = dVar13;
            }
            if (dVar17 <= 1.0) {
              dVar17 = 1.0;
            }
            if (extraout_XMM0_Qa_11 < ABS((dVar12 - dVar11) / dVar17)) goto LAB_001f81a9;
          }
          dVar10 = this->m_oldLo;
          dVar12 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j];
          (*(this->super_PostStep)._vptr_PostStep[6])(this);
          dVar11 = ABS(dVar10);
          dVar17 = ABS(dVar12);
          if (dVar11 <= dVar17) {
            dVar11 = dVar17;
          }
          if (dVar11 <= 1.0) {
            dVar11 = 1.0;
          }
          lVar6 = (long)this->m_j;
          cStatus->data[lVar6] = (uint)(ABS((dVar10 - dVar12) / dVar11) <= extraout_XMM0_Qa_15);
          goto LAB_001f8389;
        }
      }
LAB_001f81a9:
      dVar12 = this->m_lhs;
      dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[this->m_j] * dVar10;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar13 = ABS(dVar12);
      dVar17 = extraout_XMM0_Qa_12;
    }
    else {
      dVar17 = this->m_oldUp;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar18 = ABS(dVar17);
      if (dVar13 <= dVar18) {
        dVar13 = dVar18;
      }
      if (dVar13 <= 1.0) {
        dVar13 = 1.0;
      }
      if (extraout_XMM0_Qa_00 < ABS((dVar12 - dVar17) / dVar13)) {
        dVar12 = this->m_oldLo;
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        dVar17 = ABS(dVar12);
        if (dVar19 <= dVar17) {
          dVar19 = dVar17;
        }
        if (dVar19 <= 1.0) {
          dVar19 = 1.0;
        }
        if (extraout_XMM0_Qa_01 < ABS((dVar11 - dVar12) / dVar19)) goto LAB_001f81f5;
        dVar12 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (-extraout_XMM0_Qa_02 < dVar12) {
          lVar6 = (long)this->m_j;
          cStatus->data[lVar6] = ON_LOWER;
          goto LAB_001f8389;
        }
      }
      else {
        dVar12 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (dVar12 < extraout_XMM0_Qa_13) {
          lVar6 = (long)this->m_j;
          cStatus->data[lVar6] = ON_UPPER;
LAB_001f8389:
          iVar1 = this->m_i;
          rStatus->data[iVar1] = BASIC;
          (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = this->m_row_obj;
          y = r;
          break;
        }
      }
      dVar12 = this->m_lhs / dVar10;
      dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[this->m_j];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar13 = ABS(dVar12);
      dVar17 = extraout_XMM0_Qa_14;
    }
    if (dVar13 <= ABS(dVar11)) {
      dVar13 = ABS(dVar11);
    }
    if (dVar13 <= 1.0) {
      dVar13 = 1.0;
    }
    iVar1 = this->m_i;
    rStatus->data[iVar1] = (uint)(ABS((dVar12 - dVar11) / dVar13) <= dVar17);
    lVar6 = (long)this->m_j;
    cStatus->data[lVar6] = BASIC;
    (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = dVar16 / dVar10;
    goto LAB_001f7f04;
  case ZERO:
    rStatus->data[lVar5] = BASIC;
    (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = this->m_row_obj;
    y = r;
    break;
  case BASIC:
    rStatus->data[lVar5] = BASIC;
    (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = this->m_row_obj;
    dVar16 = 0.0;
    y = r;
    break;
  default:
    goto switchD_001f7baf_default;
  }
  (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar6] = dVar16;
switchD_001f7baf_default:
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}